

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

bool __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::IsNonSpecular
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this)

{
  float fVar1;
  DielectricInterfaceBxDF *pDVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  ulong uVar5;
  
  pDVar2 = this->top;
  if (pDVar2 == (DielectricInterfaceBxDF *)0x0) {
    bVar4 = 5;
    fVar1 = (this->bottom->R).values.values[0];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 == 2) {
          bVar4 = 0;
          goto LAB_00312dd1;
        }
        fVar1 = (this->bottom->R).values.values[uVar5 + 2];
        uVar5 = uVar5 + 1;
      } while ((fVar1 == 0.0) && (!NAN(fVar1)));
      bVar4 = (uVar5 < 3) * '\x05';
    }
  }
  else {
    auVar3 = vminss_avx(ZEXT416((uint)(pDVar2->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar2->mfDistrib).alpha_x));
    bVar4 = (auVar3._0_4_ < 0.001) * '\b' + 0xb;
  }
LAB_00312dd1:
  return (bVar4 & 0xc) != 0;
}

Assistant:

PBRT_CPU_GPU
    bool IsNonSpecular() const {
        BxDFFlags flags = top ? top->Flags() : bottom->Flags();
        return (flags & (BxDFFlags::Diffuse | BxDFFlags::Glossy));
    }